

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O1

int glfwExtensionSupported(char *extension)

{
  int iVar1;
  GLFWbool GVar2;
  undefined8 in_RAX;
  void *pvVar3;
  char *pcVar4;
  int iVar5;
  ulong uVar6;
  bool bVar7;
  bool bVar8;
  GLint count;
  undefined8 uStack_38;
  
  if (extension == (char *)0x0) {
    __assert_fail("extension != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/karimnaaji[P]live-glsl/deps/glfw/src/context.c"
                  ,0x2ad,"int glfwExtensionSupported(const char *)");
  }
  if (_glfw.initialized == 0) {
    iVar5 = 0x10001;
    pcVar4 = (char *)0x0;
  }
  else {
    uStack_38 = in_RAX;
    pvVar3 = _glfwPlatformGetTls(&_glfw.contextSlot);
    if (pvVar3 == (void *)0x0) {
      pcVar4 = "Cannot query extension without a current OpenGL or OpenGL ES context";
      iVar5 = 0x10002;
    }
    else {
      if (*extension != '\0') {
        if (*(int *)((long)pvVar3 + 0x210) < 3) {
          pcVar4 = (char *)(**(code **)((long)pvVar3 + 0x248))(0x1f03);
          if (pcVar4 == (char *)0x0) {
            bVar8 = false;
            _glfwInputError(0x10008,"Extension string retrieval is broken");
          }
          else {
            GVar2 = _glfwStringInExtensionString(extension,pcVar4);
            bVar8 = GVar2 == 0;
          }
          if (!bVar8) {
            return (uint)(pcVar4 != (char *)0x0);
          }
        }
        else {
          uVar6 = (long)&uStack_38 + 4;
          (**(code **)((long)pvVar3 + 0x240))(0x821d,uVar6);
          bVar8 = 0 < uStack_38._4_4_;
          if (0 < uStack_38._4_4_) {
            iVar5 = 0;
            do {
              pcVar4 = (char *)(**(code **)((long)pvVar3 + 0x238))(0x1f03,iVar5);
              if (pcVar4 == (char *)0x0) {
                bVar7 = false;
                _glfwInputError(0x10008,"Extension string retrieval is broken");
                uVar6 = 0;
              }
              else {
                iVar1 = strcmp(pcVar4,extension);
                bVar7 = iVar1 != 0;
                uVar6 = uVar6 & 0xffffffff;
                if (!bVar7) {
                  uVar6 = 1;
                }
              }
              if (!bVar7) break;
              iVar5 = iVar5 + 1;
              bVar8 = iVar5 < uStack_38._4_4_;
            } while (iVar5 < uStack_38._4_4_);
          }
          if (bVar8) {
            return (int)uVar6;
          }
        }
        iVar5 = (**(code **)((long)pvVar3 + 0x268))(extension);
        return iVar5;
      }
      pcVar4 = "Extension name cannot be an empty string";
      iVar5 = 0x10004;
    }
  }
  _glfwInputError(iVar5,pcVar4);
  return 0;
}

Assistant:

GLFWAPI int glfwExtensionSupported(const char* extension)
{
    _GLFWwindow* window;
    assert(extension != NULL);

    _GLFW_REQUIRE_INIT_OR_RETURN(GLFW_FALSE);

    window = _glfwPlatformGetTls(&_glfw.contextSlot);
    if (!window)
    {
        _glfwInputError(GLFW_NO_CURRENT_CONTEXT,
                        "Cannot query extension without a current OpenGL or OpenGL ES context");
        return GLFW_FALSE;
    }

    if (*extension == '\0')
    {
        _glfwInputError(GLFW_INVALID_VALUE, "Extension name cannot be an empty string");
        return GLFW_FALSE;
    }

    if (window->context.major >= 3)
    {
        int i;
        GLint count;

        // Check if extension is in the modern OpenGL extensions string list

        window->context.GetIntegerv(GL_NUM_EXTENSIONS, &count);

        for (i = 0;  i < count;  i++)
        {
            const char* en = (const char*)
                window->context.GetStringi(GL_EXTENSIONS, i);
            if (!en)
            {
                _glfwInputError(GLFW_PLATFORM_ERROR,
                                "Extension string retrieval is broken");
                return GLFW_FALSE;
            }

            if (strcmp(en, extension) == 0)
                return GLFW_TRUE;
        }
    }
    else
    {
        // Check if extension is in the old style OpenGL extensions string

        const char* extensions = (const char*)
            window->context.GetString(GL_EXTENSIONS);
        if (!extensions)
        {
            _glfwInputError(GLFW_PLATFORM_ERROR,
                            "Extension string retrieval is broken");
            return GLFW_FALSE;
        }

        if (_glfwStringInExtensionString(extension, extensions))
            return GLFW_TRUE;
    }

    // Check if extension is in the platform-specific string
    return window->context.extensionSupported(extension);
}